

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

int loop_type_compar(ON_BrepLoop **ppLoopA,ON_BrepLoop **ppLoopB)

{
  TYPE TVar1;
  TYPE TVar2;
  uint uVar3;
  
  TVar1 = (*ppLoopA)->m_type;
  TVar2 = (*ppLoopB)->m_type;
  uVar3 = 0;
  if (TVar1 != TVar2) {
    if (TVar1 == unknown) {
      return 1;
    }
    uVar3 = 0xffffffff;
    if ((int)TVar2 <= (int)TVar1 && TVar2 != unknown) {
      uVar3 = (uint)((int)TVar2 < (int)TVar1);
    }
  }
  return uVar3;
}

Assistant:

static int loop_type_compar(const ON_BrepLoop *const* ppLoopA, const ON_BrepLoop *const* ppLoopB )
{
  const ON_BrepLoop* loopA = *ppLoopA;
  const ON_BrepLoop* loopB = *ppLoopB;
  if ( loopA->m_type == loopB->m_type )
    return 0;
  if ( loopA->m_type == ON_BrepLoop::unknown )
    return 1;
  if ( loopB->m_type == ON_BrepLoop::unknown )
    return -1;
  if ( loopA->m_type < loopB->m_type )
    return -1;
  if ( loopA->m_type > loopB->m_type )
    return 1;
  return 0;
}